

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aems.cpp
# Opt level: O0

void __thiscall despot::AEMS::BeliefUpdate(AEMS *this,ACT_TYPE action,OBS_TYPE obs)

{
  VNode *pVVar1;
  int iVar2;
  QNode *pQVar3;
  VNode *pVVar4;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_00;
  Belief *pBVar5;
  undefined4 extraout_var;
  log_ostream *plVar6;
  ostream *poVar7;
  Belief *new_belief;
  VNode *node;
  OBS_TYPE obs_local;
  AEMS *pAStack_10;
  ACT_TYPE action_local;
  AEMS *this_local;
  
  node = (VNode *)obs;
  obs_local._4_4_ = action;
  pAStack_10 = this;
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar6 = logging::stream(3);
    poVar7 = std::operator<<(&plVar6->super_ostream,
                             "- Updating belief, history and root with action ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,obs_local._4_4_);
    poVar7 = std::operator<<(poVar7," and observation ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,(ulong)node);
    std::operator<<(poVar7,"...");
  }
  if ((this->reuse_ & 1U) == 0) {
    pVVar1 = this->root_;
    if (pVVar1 != (VNode *)0x0) {
      VNode::~VNode(pVVar1);
      operator_delete(pVVar1,0x98);
    }
    this->root_ = (VNode *)0x0;
    iVar2 = (*(this->model_->super_DSPOMDP)._vptr_DSPOMDP[0x1c])
                      (this->model_,(this->super_Solver).belief_,(ulong)obs_local._4_4_,node);
    pBVar5 = (this->super_Solver).belief_;
    if (pBVar5 != (Belief *)0x0) {
      (*pBVar5->_vptr_Belief[1])();
    }
    (this->super_Solver).belief_ = (Belief *)CONCAT44(extraout_var,iVar2);
  }
  else {
    pQVar3 = VNode::Child(this->root_,obs_local._4_4_);
    pVVar4 = QNode::Child(pQVar3,(OBS_TYPE)node);
    pQVar3 = VNode::Child(this->root_,obs_local._4_4_);
    this_00 = QNode::children(pQVar3);
    std::
    map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
    ::erase(this_00,(key_type *)&node);
    pVVar1 = this->root_;
    if (pVVar1 != (VNode *)0x0) {
      VNode::~VNode(pVVar1);
      operator_delete(pVVar1,0x98);
    }
    this->root_ = pVVar4;
    this->root_->likelihood = 1.0;
    VNode::parent(this->root_,(QNode *)0x0);
    pBVar5 = VNode::belief(this->root_);
    (this->super_Solver).belief_ = pBVar5;
  }
  History::Add(&(this->super_Solver).history_,obs_local._4_4_,(OBS_TYPE)node);
  iVar2 = logging::level();
  if ((0 < iVar2) && (iVar2 = logging::level(), 2 < iVar2)) {
    plVar6 = logging::stream(3);
    poVar7 = std::operator<<(&plVar6->super_ostream,"Done!");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void AEMS::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	logi << "- Updating belief, history and root with action " << action
		<< " and observation " << obs << "...";

	if (reuse_) {
		VNode* node = root_->Child(action)->Child(obs);
		root_->Child(action)->children().erase(obs);
		delete root_;
		root_ = node;
		root_->likelihood = 1.0;
		root_->parent(NULL);

		belief_ = root_->belief();
	} else {
		delete root_;
		root_ = NULL;

		Belief* new_belief = model_->Tau(belief_, action, obs);
		delete belief_;
		belief_ = new_belief;

		// belief_->Update(action, obs); // approx update
	}

	history_.Add(action, obs);

	logi << "Done!" << endl;
}